

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

int ZSTD_isRLE(BYTE *src,size_t length)

{
  byte bVar1;
  size_t sVar2;
  ulong local_60;
  size_t u;
  size_t i;
  size_t prefixLength;
  size_t unrollMask;
  size_t unrollSize;
  size_t valueST;
  BYTE value;
  BYTE *ip;
  size_t length_local;
  BYTE *src_local;
  
  bVar1 = *src;
  u = length & 0x1f;
  if (length == 1) {
    src_local._4_4_ = 1;
  }
  else if ((u == 0) || (sVar2 = ZSTD_count(src + 1,src,src + u), sVar2 == u - 1)) {
    for (; u != length; u = u + 0x20) {
      for (local_60 = 0; local_60 < 0x20; local_60 = local_60 + 8) {
        sVar2 = MEM_readST(src + local_60 + u);
        if (sVar2 != (ulong)bVar1 * 0x101010101010101) {
          return 0;
        }
      }
    }
    src_local._4_4_ = 1;
  }
  else {
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

static int ZSTD_isRLE(const BYTE* src, size_t length) {
    const BYTE* ip = src;
    const BYTE value = ip[0];
    const size_t valueST = (size_t)((U64)value * 0x0101010101010101ULL);
    const size_t unrollSize = sizeof(size_t) * 4;
    const size_t unrollMask = unrollSize - 1;
    const size_t prefixLength = length & unrollMask;
    size_t i;
    size_t u;
    if (length == 1) return 1;
    /* Check if prefix is RLE first before using unrolled loop */
    if (prefixLength && ZSTD_count(ip+1, ip, ip+prefixLength) != prefixLength-1) {
        return 0;
    }
    for (i = prefixLength; i != length; i += unrollSize) {
        for (u = 0; u < unrollSize; u += sizeof(size_t)) {
            if (MEM_readST(ip + i + u) != valueST) {
                return 0;
            }
        }
    }
    return 1;
}